

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

u8string *
jessilib::io::process_message<jessilib::io::ansi::text_wrapper>
          (u8string *__return_storage_ptr__,formatted_message *msg)

{
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  args_00;
  basic_string_view<char8_t> format_str;
  bool bVar1;
  vector<jessilib::io::text,_std::allocator<jessilib::io::text>_> *this;
  reference in_text;
  detail *this_00;
  basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  *args_01;
  size_type sVar2;
  u8string *puVar3;
  char8_t *s;
  size_type count;
  text_wrapper *value;
  undefined1 auStack_a8 [8];
  string_view_type fmt_view;
  format_args_type text_args;
  text *text;
  const_iterator __end2;
  const_iterator __begin2;
  vector<jessilib::io::text,_std::allocator<jessilib::io::text>_> *__range2;
  vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
  args;
  formatted_message *msg_local;
  
  args.
  super__Vector_base<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)msg;
  std::
  vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
  ::vector((vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
            *)&__range2);
  this = formatted_message::get_message
                   ((formatted_message *)
                    args.
                    super__Vector_base<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __end2 = std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::begin(this);
  text = (text *)std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_jessilib::io::text_*,_std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>_>
                      (&__end2,(__normal_iterator<const_jessilib::io::text_*,_std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>_>
                                *)&text);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_text = __gnu_cxx::
              __normal_iterator<const_jessilib::io::text_*,_std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>_>
              ::operator*(&__end2);
    this_00 = (detail *)wrap_text<jessilib::io::ansi::text_wrapper,_nullptr>(in_text);
    fmt::v8::detail::
    make_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>,jessilib::io::ansi::text_wrapper>
              ((basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                *)&text_args.field_1,this_00,value);
    std::
    vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>,std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>>
    ::
    emplace_back<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>
              ((vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>,std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>>>>
                *)&__range2,
               (basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                *)&text_args.field_1);
    __gnu_cxx::
    __normal_iterator<const_jessilib::io::text_*,_std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>_>
    ::operator++(&__end2);
  }
  args_01 = std::
            vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
            ::data((vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
                    *)&__range2);
  sVar2 = std::
          vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
          ::size((vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
                  *)&__range2);
  fmt::v8::
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
  ::basic_format_args((basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                       *)&fmt_view.size_,args_01,(int)sVar2);
  puVar3 = formatted_message::format_abi_cxx11_
                     ((formatted_message *)
                      args.
                      super__Vector_base<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  s = std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::data
                (puVar3);
  puVar3 = formatted_message::format_abi_cxx11_
                     ((formatted_message *)
                      args.
                      super__Vector_base<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  count = std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
          size(puVar3);
  fmt::v8::basic_string_view<char8_t>::basic_string_view
            ((basic_string_view<char8_t> *)auStack_a8,s,count);
  format_str.size_ = (size_t)fmt_view.data_;
  format_str.data_ = (char8_t *)auStack_a8;
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
        )text_args.desc_;
  args_00.desc_ = fmt_view.size_;
  fmt::v8::vformat<char8_t,_0>(__return_storage_ptr__,format_str,args_00);
  std::
  vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
  ::~vector((vector<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>,_std::allocator<fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_>_>
             *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::u8string process_message(const jessilib::io::formatted_message& msg) {
	using FormatCharT = char8_t;
	using format_args_type = fmt::basic_format_args<fmt::buffer_context<FormatCharT>>;
	using format_arg_type = format_args_type::format_arg;
	using format_context_type = fmt::buffer_context<FormatCharT>;
	using string_view_type = fmt::v8::basic_string_view<FormatCharT>;

	// Populate args
	std::vector<format_arg_type> args;
	for (auto& text : msg.get_message()) {
		args.emplace_back(fmt::detail::make_arg<format_context_type>(wrap_text<WrapperT>(text)));
	}

	// Pass args into vformat
	format_args_type text_args{ args.data(), static_cast<int>(args.size()) };
	string_view_type fmt_view{ msg.format().data(), msg.format().size() };
	return fmt::vformat(fmt_view, text_args);
}